

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring64_bitmap_remove_bulk
               (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  ulong *puVar1;
  ulong uVar2;
  container_t *c;
  byte typecode;
  _Bool _Var3;
  int iVar4;
  art_val_t *leaf_00;
  container_t *c_00;
  uint8_t typecode_00;
  uint8_t typecode2;
  uint8_t high48 [6];
  leaf_t leaf;
  byte local_41;
  uint local_40;
  ushort local_3c;
  ulong local_38;
  
  local_40 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_3c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  puVar1 = context->leaf;
  if ((puVar1 == (ulong *)0x0) ||
     (iVar4 = art_compare_keys(context->high_bytes,(art_key_chunk_t *)&local_40), iVar4 != 0)) {
    leaf_00 = art_find(&r->art,(art_key_chunk_t *)&local_40);
    containerptr_roaring64_bitmap_remove(r,(uint8_t *)&local_40,(uint16_t)val,leaf_00);
    context->leaf = leaf_00;
    *(uint *)context->high_bytes = local_40;
    *(ushort *)(context->high_bytes + 4) = local_3c;
  }
  else {
    uVar2 = *puVar1;
    c = r->containers[uVar2 >> 8];
    typecode_00 = (uint8_t)uVar2;
    c_00 = container_remove(c,(uint16_t)val,typecode_00,&local_41);
    typecode = local_41;
    if (c_00 != c) {
      container_free(c,typecode_00);
      puVar1 = context->leaf;
      uVar2 = *puVar1;
      r->containers[uVar2 >> 8] = c_00;
      *puVar1 = uVar2 & 0xffffffffffffff00 | (ulong)local_41;
      typecode = local_41;
    }
    _Var3 = container_nonzero_cardinality(c_00,typecode);
    if (!_Var3) {
      container_free(c_00,typecode);
      art_erase(&r->art,(art_key_chunk_t *)&local_40,&local_38);
      local_38 = local_38 >> 8;
      r->containers[local_38] = (container_t *)0x0;
      if (local_38 < r->first_free) {
        r->first_free = local_38;
      }
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_remove_bulk(roaring64_bitmap_t *r,
                                  roaring64_bulk_context_t *context,
                                  uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    if (context->leaf != NULL &&
        compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode = get_typecode(*context->leaf);
        container_t *container = get_container(r, *context->leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_remove(container, low16, typecode, &typecode2);
        if (container2 != container) {
            container_free(container, typecode);
            replace_container(r, context->leaf, container2, typecode2);
        }
        if (!container_nonzero_cardinality(container2, typecode2)) {
            container_free(container2, typecode2);
            leaf_t leaf;
            bool erased = art_erase(art, high48, (art_val_t *)&leaf);
            assert(erased);
            remove_container(r, leaf);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(art, high48);
        containerptr_roaring64_bitmap_remove(r, high48, low16, leaf);
        context->leaf = leaf;
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}